

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul.c
# Opt level: O3

void pnga_matmul(char *transa,char *transb,void *alpha,void *beta,Integer g_a,Integer ailo,
                Integer aihi,Integer ajlo,Integer ajhi,Integer g_b,Integer bilo,Integer bihi,
                Integer bjlo,Integer bjhi,Integer g_c,Integer cilo,Integer cihi,Integer cjlo,
                Integer cjhi)

{
  undefined1 *puVar1;
  uint uVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  SingleComplex adim;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  Integer IVar17;
  Integer grp_id;
  Integer IVar18;
  Integer IVar19;
  logical lVar20;
  logical lVar21;
  undefined1 *puVar22;
  ulong uVar23;
  ulong uVar24;
  undefined1 *puVar25;
  ulong uVar27;
  uint uVar28;
  undefined1 *puVar29;
  undefined1 *puVar30;
  uint uVar31;
  undefined1 *puVar32;
  long lVar33;
  size_t sVar34;
  undefined2 *puVar35;
  byte bVar36;
  int iVar37;
  Integer IVar38;
  undefined1 *puVar39;
  undefined1 *puVar40;
  undefined4 uVar41;
  uint uVar42;
  int iVar43;
  long icode;
  undefined1 *puVar44;
  short sVar45;
  int iVar46;
  char *pcVar47;
  undefined1 *puVar48;
  DoubleComplex *pDVar49;
  Integer *pIVar50;
  undefined1 *puVar51;
  DoubleComplex *pDVar52;
  DoubleComplex *pDVar53;
  int iVar54;
  undefined1 *puVar55;
  undefined1 *puVar56;
  long lVar57;
  uint uVar58;
  undefined1 *puVar59;
  int iVar60;
  undefined1 *puVar61;
  long lVar62;
  undefined1 *puVar63;
  bool bVar64;
  bool bVar65;
  bool bVar66;
  bool bVar67;
  double dVar68;
  double dVar69;
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  int iVar100;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  int iVar107;
  undefined1 auVar106 [16];
  int iVar112;
  undefined1 in_XMM8 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 in_XMM9 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 in_XMM10 [16];
  undefined1 auVar116 [16];
  DoubleComplex *pDStack_10660;
  ulong uStack_10658;
  DoubleComplex *pDStack_10650;
  long lStack_10648;
  ulong uStack_10640;
  DoubleComplex *pDStack_10630;
  char cStack_10620;
  DoubleComplex *pDStack_10618;
  Integer jdim_1;
  DoubleComplex *pDStack_10600;
  undefined1 *puStack_105f8;
  int iStack_105ec;
  Integer kdim_1;
  undefined1 *puStack_105e0;
  undefined1 *puStack_105d0;
  undefined8 uStack_105c8;
  DoubleComplex *pDStack_105c0;
  undefined1 *puStack_105b8;
  DoubleComplex *pDStack_105b0;
  undefined1 *puStack_105a8;
  DoubleComplex *pDStack_105a0;
  DoubleComplex *pDStack_10598;
  Integer cdim;
  undefined1 *puStack_10588;
  Integer IStack_10580;
  undefined1 *puStack_10578;
  byte *pbStack_10570;
  byte *pbStack_10568;
  Integer atype;
  Integer cdim_prev;
  DoubleComplex *pDStack_10550;
  undefined1 *puStack_10540;
  DoubleComplex ONE;
  Integer dims [2];
  DoubleComplex *a_ar [2];
  DoubleComplex *c;
  SingleComplex ONE_CF;
  DoubleComplex *apDStack_104a8 [2];
  Integer idim;
  undefined1 *puStack_10488;
  undefined1 *puStack_10480;
  Integer rank;
  int iStack_1046c;
  Integer kdim;
  Integer *pIStack_10450;
  undefined1 *puStack_10448;
  undefined1 *puStack_10440;
  Integer ctype;
  Integer bdim_next;
  Integer jdim;
  undefined8 uStack_10420;
  Integer loB [2];
  Integer hiA [2];
  Integer loA [2];
  Integer btype;
  Integer cndim;
  Integer IStack_103a0;
  Integer chi [2];
  Integer clo [2];
  Integer hiC [2];
  Integer loC [2];
  Integer hiB [2];
  char *pcStack_10348;
  Integer ctype_1;
  Integer ld [2];
  Integer hiC_1 [2];
  int aiStack_10028 [8188];
  Integer irreg;
  int aiStack_8030 [5];
  uint local_801c [56];
  undefined2 local_7f3c [16262];
  DoubleComplex *pDVar26;
  
  IStack_10580 = ailo;
  pbStack_10570 = (byte *)transb;
  pbStack_10568 = (byte *)transa;
  IVar17 = pnga_nodeid();
  loA[0] = 0;
  loA[1] = 0;
  hiA[0] = 0;
  hiA[1] = 0;
  loB[0] = 0;
  loB[1] = 0;
  hiB[0] = 0;
  hiB[1] = 0;
  loC[0] = 0;
  loC[1] = 0;
  hiC[0] = 0;
  hiC[1] = 0;
  grp_id = pnga_get_pgroup(g_a);
  IVar18 = pnga_get_pgroup(g_b);
  IVar19 = pnga_get_pgroup(g_c);
  CYCLIC_DISTR_OPT_FLAG = '\x01';
  CONTIG_CHUNKS_OPT_FLAG = 0;
  DIRECT_ACCESS_OPT_FLAG = 0;
  bVar65 = _ga_sync_begin != 0;
  iStack_1046c = _ga_sync_end;
  _ga_sync_begin = 1;
  _ga_sync_end = 1;
  if (bVar65) {
    pnga_pgroup_sync(grp_id);
  }
  if (IVar19 != grp_id || IVar18 != grp_id) {
    pnga_error("Arrays must be defined on same group",0);
  }
  lVar20 = pnga_is_mirrored(g_a);
  lVar21 = pnga_is_mirrored(g_b);
  if (lVar20 == lVar21) {
    lVar20 = pnga_is_mirrored(g_a);
    lVar21 = pnga_is_mirrored(g_c);
    if (lVar20 != lVar21) goto LAB_00128e98;
  }
  else {
LAB_00128e98:
    IVar18 = pnga_nnodes();
    pnga_error("Processors do not match for all arrays",IVar18);
  }
  pnga_inquire(g_a,&atype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      lVar62 = 1;
      IVar18 = dims[0];
      if (IStack_10580 < aihi) {
        IVar18 = 1;
        lVar62 = dims[0];
      }
    }
    else {
      lVar62 = dims[0];
      IVar18 = dims[1];
      if (rank != 2) {
        pcVar47 = "rank must be atleast 1";
        goto LAB_00128f34;
      }
    }
  }
  else {
    pcVar47 = "rank is greater than 2";
LAB_00128f34:
    pnga_error(pcVar47,rank);
    lVar62 = 0;
    IVar18 = 0;
  }
  pnga_inquire(g_b,&btype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      IVar19 = dims[0];
      lVar57 = 1;
      if (bilo < bihi) {
        IVar19 = 1;
        lVar57 = dims[0];
      }
    }
    else {
      IVar19 = dims[1];
      lVar57 = dims[0];
      if (rank != 2) {
        pcVar47 = "rank must be atleast 1";
        goto LAB_00128fc8;
      }
    }
  }
  else {
    pcVar47 = "rank is greater than 2";
LAB_00128fc8:
    pnga_error(pcVar47,rank);
    IVar19 = 0;
    lVar57 = 0;
  }
  pnga_inquire(g_c,&ctype,&rank,dims);
  if (rank < 3) {
    if (rank == 1) {
      IVar38 = dims[0];
      lVar33 = 1;
      if (cilo < cihi) {
        IVar38 = 1;
        lVar33 = dims[0];
      }
    }
    else {
      IVar38 = dims[1];
      lVar33 = dims[0];
      if (rank != 2) {
        pcVar47 = "rank must be atleast 1";
        goto LAB_00129061;
      }
    }
  }
  else {
    pcVar47 = "rank is greater than 2";
LAB_00129061:
    pnga_error(pcVar47,rank);
    IVar38 = 0;
    lVar33 = 0;
  }
  icode = CONCAT44(atype._4_4_,(int)atype);
  if ((icode != btype) || (icode != ctype)) {
    pnga_error(" types mismatch ",0);
    icode = CONCAT44(atype._4_4_,(int)atype);
  }
  if ((4 < icode - 0x3ebU) || (icode - 0x3ebU == 2)) {
    pnga_error(" type error",icode);
  }
  if ((*pbStack_10568 | 0x20) == 0x6e) {
    if ((IStack_10580 < 1) || (IVar18 < ajhi || (ajlo < 1 || lVar62 < aihi))) {
LAB_00129135:
      pnga_error("  g_a indices out of range ",g_a);
    }
  }
  else if ((IStack_10580 < 1) || (lVar62 < ajhi || (ajlo < 1 || IVar18 < aihi))) goto LAB_00129135;
  if ((*pbStack_10570 | 0x20) == 0x6e) {
    if ((bilo < 1) || (IVar19 < bjhi || (bjlo < 1 || lVar57 < bihi))) {
LAB_001291c1:
      pnga_error("  g_b indices out of range ",g_b);
    }
  }
  else if ((bilo < 1) || (lVar57 < bjhi || (bjlo < 1 || IVar19 < bihi))) goto LAB_001291c1;
  if ((((cilo < 1) || (cjlo < 1)) || (lVar33 < cihi)) || (IVar38 < cjhi)) {
    pnga_error("  g_c indices out of range ",g_c);
  }
  puVar29 = (undefined1 *)(aihi - IStack_10580);
  puVar56 = puVar29 + 1;
  puVar22 = (undefined1 *)(bjhi - bjlo);
  if ((undefined1 *)(cihi - cilo) != puVar29) {
    pnga_error(" a & c dims error",(Integer)puVar56);
  }
  puVar39 = (undefined1 *)(ajhi - ajlo);
  puVar59 = puVar22 + 1;
  if ((undefined1 *)(cjhi - cjlo) != puVar22) {
    pnga_error(" b & c dims error",(Integer)puVar59);
  }
  puVar44 = puVar39 + 1;
  if ((undefined1 *)(bihi - bilo) != puVar39) {
    pnga_error(" a & b dims error",(Integer)puVar44);
  }
  if (((GA[g_c + 1000].irreg == 1) || (GA[g_b + 1000].irreg == 1)) ||
     ((GA[g_a + 1000].irreg == 1 || (_gai_matmul_patch_flag == 1)))) {
    bVar65 = true;
  }
  else {
    bVar65 = false;
  }
  pnga_inquire(g_c,&ctype,&rank,dims);
  bVar66 = true;
  if ((undefined1 *)dims[1] == puVar59 && (undefined1 *)dims[0] == puVar56) {
    bVar66 = bVar65;
  }
  puStack_10578 = puVar56;
  if ((bVar66) || (iVar12 = GA_Cluster_nnodes(), 1 < iVar12)) {
    bVar36 = 0;
  }
  else {
    bVar36 = 1;
    CONTIG_CHUNKS_OPT_FLAG = 1;
    DIRECT_ACCESS_OPT_FLAG = 1;
  }
  IVar18 = pnga_total_blocks(g_c);
  if (-1 < IVar18) {
    loA[0] = IStack_10580;
    loA[1] = ajlo;
    hiA[0] = aihi;
    hiA[1] = ajhi;
    loB[0] = bilo;
    loB[1] = bjlo;
    hiB[0] = bihi;
    hiB[1] = bjhi;
    loC[0] = cilo;
    loC[1] = cjlo;
    hiC[0] = cihi;
    hiC[1] = cjhi;
    pnga_matmul_basic((char *)pbStack_10568,(char *)pbStack_10570,alpha,beta,g_a,loA,hiA,g_b,loB,hiB
                      ,g_c,loC,hiC);
    return;
  }
  pnga_distribution(g_a,IVar17,loA,hiA);
  pnga_distribution(g_b,IVar17,loB,hiB);
  pnga_distribution(g_c,IVar17,loC,hiC);
  pDVar53 = (DoubleComplex *)0x0;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(BYTE_ARRAY_001d3279 + CONCAT44(atype._4_4_,(int)atype) * 0x10 + 0x30f);
  puStack_105f8 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x10)) / auVar76,0);
  pDVar52 = (DoubleComplex *)(hiA[0] - loA[0]);
  if ((long)(hiC[0] - loC[0]) < (long)(hiA[0] - loA[0])) {
    pDVar52 = (DoubleComplex *)(hiC[0] - loC[0]);
  }
  pDStack_105b0 = (DoubleComplex *)(hiB[1] - loB[1]);
  if ((long)(hiC[1] - loC[1]) < (long)(hiB[1] - loB[1])) {
    pDStack_105b0 = (DoubleComplex *)(hiC[1] - loC[1]);
  }
  pDVar26 = (DoubleComplex *)(hiB[0] - loB[0]);
  if ((long)(hiA[1] - loA[1]) < (long)(hiB[0] - loB[0])) {
    pDVar26 = (DoubleComplex *)(hiA[1] - loA[1]);
  }
  if ((long)pDVar52 < 1) {
    pDVar52 = pDVar53;
  }
  puVar56 = (undefined1 *)((long)&pDVar52->real + 1);
  if ((long)pDStack_105b0 < 1) {
    pDStack_105b0 = pDVar53;
  }
  puVar51 = (undefined1 *)((long)&pDStack_105b0->real + 1);
  if ((long)pDVar26 < 1) {
    pDVar26 = pDVar53;
  }
  puVar48 = (undefined1 *)((long)&pDVar26->real + 1);
  irreg = 0;
  if ((((3 < (ulong)puVar56 / (ulong)puVar48) || (3 < (ulong)puVar48 / (ulong)puVar56)) ||
      (3 < (ulong)puVar51 / (ulong)puVar48)) || (3 < (ulong)puVar48 / (ulong)puVar51)) {
    irreg = 1;
  }
  IVar17 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(grp_id,IVar17,&irreg,1,"max");
  bVar65 = true;
  if (irreg != 1) {
    bVar65 = bVar66;
  }
  pDStack_10598 = (DoubleComplex *)CONCAT44(pDStack_10598._4_4_,2 - (uint)bVar36);
  if (bVar65) {
    bVar66 = false;
    pDStack_10660 = (DoubleComplex *)0x0;
  }
  else {
    pDStack_10660 =
         gai_get_armci_memory
                   ((Integer)puVar56,(Integer)puVar51,(Integer)puVar48,(short)(2 - (uint)bVar36),
                    CONCAT44(atype._4_4_,(int)atype));
    bVar66 = pDStack_10660 != (DoubleComplex *)0x0;
    a_ar[0] = pDStack_10660;
  }
  IVar17 = CONCAT44(atype._4_4_,(int)atype);
  IVar18 = pnga_nnodes();
  irreg = pnga_memory_avail_type(IVar17);
  if (bVar65) {
    dVar68 = pow(((double)(long)puVar59 * (double)(long)puStack_10578 * (double)(long)puVar44) /
                 (double)(IVar18 * 10),0.3333333333333333);
    puVar61 = (undefined1 *)0x100;
    if (0x100 < (long)dVar68) {
      puVar61 = (undefined1 *)(long)dVar68;
    }
  }
  else {
    iVar12 = (int)puVar51;
    if ((int)puVar51 < (int)puVar56) {
      iVar12 = (int)puVar56;
    }
    if (iVar12 <= (int)puVar48) {
      iVar12 = (int)puVar48;
    }
    puVar61 = (undefined1 *)(long)iVar12;
  }
  IVar18 = pnga_type_f2c(0x3f2);
  pnga_pgroup_gop(grp_id,IVar18,&irreg,1,"min");
  puVar55 = (undefined1 *)((ulong)bVar36 * 0x80 + 0x80);
  puVar30 = puVar55;
  puVar32 = puVar61;
  puVar25 = puVar55;
  if ((long)puVar55 < (long)puVar61) {
    if ((irreg < 0x40) && (IVar18 = pnga_pgroup_nodeid(grp_id), IVar18 == 0)) {
      pnga_error("NotEnough memory",irreg);
    }
    uVar23 = (ulong)(uint)(3 << (bVar36 ^ 1));
    dVar68 = (double)((long)((long)((double)irreg * 0.9) - uVar23) / (long)uVar23);
    if (dVar68 < 0.0) {
      dVar69 = sqrt(dVar68);
    }
    else {
      dVar69 = SQRT(dVar68);
    }
    if ((long)dVar69 < (long)puVar61) {
      if (dVar68 < 0.0) {
        dVar68 = sqrt(dVar68);
      }
      else {
        dVar68 = SQRT(dVar68);
      }
      puVar61 = (undefined1 *)(long)dVar68;
    }
    if (!bVar65) {
      puVar55 = (undefined1 *)0x400;
      puVar30 = (undefined1 *)0x400;
      puVar32 = (undefined1 *)0x400;
      puVar25 = (undefined1 *)0x400;
      if (bVar66) goto LAB_001299b2;
    }
    puVar55 = puVar61;
    puVar30 = puVar61;
    puVar25 = puVar61;
    if (!bVar65) {
      dVar68 = (double)((long)puVar61 * (long)puVar61);
      puVar32 = puVar61;
      if (((long)puVar56 < (long)puVar61) && ((long)puVar61 <= (long)pDVar26)) {
        puVar55 = (undefined1 *)(long)(dVar68 / (double)(long)puVar56);
        if ((long)puVar48 < (long)(dVar68 / (double)(long)puVar56)) {
          puVar55 = puVar48;
        }
        puVar30 = (undefined1 *)(long)(dVar68 / (double)(long)puVar55);
        puVar25 = puVar56;
        if ((long)puVar51 < (long)(dVar68 / (double)(long)puVar55)) {
          puVar30 = puVar51;
        }
      }
      else if (((long)puVar61 <= (long)pDVar52) && ((long)puVar48 < (long)puVar61)) {
        puVar30 = (undefined1 *)(long)((1.0 / (double)(long)puVar48) * dVar68);
        puVar25 = puVar30;
        if ((long)puVar56 < (long)puVar30) {
          puVar25 = puVar56;
        }
        puVar55 = puVar48;
        if ((long)puVar51 < (long)puVar30) {
          puVar30 = puVar51;
        }
      }
      goto LAB_001299b2;
    }
    puVar25 = puStack_10578;
    if ((long)puVar61 < (long)puStack_10578) {
      puVar25 = puVar61;
    }
    puVar30 = puVar59;
    if ((long)puVar61 < (long)puVar59) {
      puVar30 = puVar61;
    }
    puVar55 = puVar44;
    if ((long)puVar61 < (long)puVar44) {
      puVar55 = puVar61;
    }
LAB_00129a3b:
    puVar56 = puVar25;
    if ((long)puVar25 < 2) {
      puVar56 = (undefined1 *)0x1;
    }
    if ((long)puVar30 < 2) {
      puVar30 = (undefined1 *)0x1;
    }
    puVar59 = (undefined1 *)0x1;
    if (1 < (long)puVar55) {
      puVar59 = puVar55;
    }
  }
  else {
LAB_001299b2:
    if ((bVar65) || ((CONTIG_CHUNKS_OPT_FLAG & 1) != 0)) goto LAB_00129a3b;
    if (((long)puVar25 <= (long)puVar56) || ((long)puVar30 <= (long)puVar51)) {
      if ((double)(long)puVar56 < (double)((long)puVar32 * (long)puVar32)) {
        lVar62 = (long)((double)((long)puVar32 * (long)puVar32) / (double)(long)puVar56);
        puVar30 = puVar51;
        if (lVar62 <= (long)pDStack_105b0) {
          uVar23 = 1;
          do {
            puVar30 = (undefined1 *)((ulong)puVar51 / uVar23);
            uVar23 = uVar23 + 1;
          } while (lVar62 < (long)puVar30);
        }
        puVar55 = puVar30;
        puVar25 = puVar56;
        if ((long)puVar56 < (long)puVar30) {
          puVar55 = puVar56;
        }
      }
      goto LAB_00129a3b;
    }
    puVar59 = puVar51;
    puVar30 = puVar51;
    if (puVar56 < puVar51) {
      puVar59 = puVar56;
    }
  }
  lVar62 = (long)puVar59 << (bVar36 ^ 1);
  uVar23 = *(ulong *)(BYTE_ARRAY_001d3279 + IVar17 * 0x10 + 0x30f);
  if (pDStack_10660 == (DoubleComplex *)0x0) {
    pDStack_10660 =
         gai_get_armci_memory
                   ((Integer)puVar56,(Integer)puVar30,(Integer)puVar59,(short)pDStack_10598,
                    CONCAT44(atype._4_4_,(int)atype));
    a_ar[0] = pDStack_10660;
    if (pDStack_10660 == (DoubleComplex *)0x0) {
      pDStack_10660 =
           (DoubleComplex *)
           pnga_malloc((uint)(0x30 << (bVar36 ^ 1)) / uVar23 + lVar62 * (long)puVar56 +
                       (long)(puVar56 + lVar62) * (long)puVar30,(int)atype,"GA mulmat bufs");
      a_ar[0] = pDStack_10660;
    }
    else {
      bVar66 = true;
    }
  }
  uVar23 = (ulong)((long)puVar59 * (long)puVar56) / (ulong)puStack_105f8;
  if (bVar36 == 0) {
    a_ar[1] = pDStack_10660 + uVar23 + 1;
    lVar62 = uVar23 * 2 + 2;
    uVar24 = (ulong)((long)puVar59 * (long)puVar30) / (ulong)puStack_105f8;
    uVar27 = uVar23 * 2 + uVar24 + 2;
    apDStack_104a8[1] = pDStack_10660 + uVar23 * 2 + uVar24 + 3;
  }
  else {
    lVar62 = uVar23 + 1;
    uVar24 = (ulong)((long)puVar59 * (long)puVar30) / (ulong)puStack_105f8;
    uVar27 = uVar23;
  }
  pDStack_10650 = pDStack_10660 + lVar62;
  lVar62 = CONCAT44(atype._4_4_,(int)atype);
  apDStack_104a8[0] = pDStack_10650;
  if (lVar62 == 0x3ec) {
    bVar64 = NAN(*beta);
    bVar67 = *beta == 0.0;
LAB_00129c40:
    if ((!bVar67) || (bVar64)) goto LAB_00129c8c;
    clo[0] = cilo;
    clo[1] = cjlo;
    chi[0] = cihi;
    chi[1] = cjhi;
    iStack_105ec = (int)CONCAT71((int7)((ulong)cjhi >> 8),1);
  }
  else {
    if (lVar62 != 0x3ee) {
      if (lVar62 == 0x3ef) {
        if ((*beta != 0.0) || (NAN(*beta))) goto LAB_00129c8c;
        bVar64 = NAN(*(double *)((long)beta + 8));
        bVar67 = *(double *)((long)beta + 8) == 0.0;
      }
      else {
        bVar64 = NAN(*beta);
        bVar67 = *beta == 0.0;
      }
      goto LAB_00129c40;
    }
    if ((*beta == 0.0) && (!NAN(*beta))) {
      bVar64 = NAN(*(float *)((long)beta + 4));
      bVar67 = *(float *)((long)beta + 4) == 0.0;
      goto LAB_00129c40;
    }
LAB_00129c8c:
    clo[0] = cilo;
    clo[1] = cjlo;
    chi[0] = cihi;
    chi[1] = cjhi;
    pnga_scale_patch(g_c,clo,chi,beta);
    iStack_105ec = 0;
  }
  pDVar52 = pDStack_10660 + uVar27 + uVar24 + 2;
  puStack_10578 = (undefined1 *)CONCAT44(atype._4_4_,(int)atype);
  if (bVar36 != 0) {
    bVar65 = false;
    cdim_prev = (Integer)pDVar52;
    IVar17 = pnga_nodeid();
    irreg = 0;
    aiStack_8030[0] = 0;
    aiStack_8030[1] = 0;
    hiC_1[0] = 0;
    hiC_1[1] = 0;
    ONE.real = 1.0;
    ONE.imag = 0.0;
    ONE_CF.real = 1.0;
    ONE_CF.imag = 0.0;
    pnga_distribution(g_c,IVar17,&irreg,hiC_1);
    IVar18 = irreg;
    IVar17 = hiC_1[0];
    iVar12 = (int)hiC_1[1];
    iVar60 = (int)aiStack_8030._0_8_;
    if (DIRECT_ACCESS_OPT_FLAG == 0) {
      if ((((long)puVar56 < (long)(((int)hiC_1[0] - (int)irreg) + 1)) ||
          ((long)puVar30 < (long)(((ulong)(uint)(iVar12 - iVar60) << 0x20) + 0x100000000) >> 0x20))
         || ((long)puVar59 < ((long)puVar39 << 0x20) + 0x100000000 >> 0x20)) {
        bVar65 = false;
      }
      else {
        pnga_access_ptr(g_c,&irreg,hiC_1,&cdim_prev,ld);
        bVar65 = true;
      }
    }
    puVar22 = (undefined1 *)(long)(iVar60 + -1);
    puVar29 = (undefined1 *)(long)(iVar12 + -1);
    if ((long)puVar22 <= (long)puVar29) {
      puVar51 = (undefined1 *)(long)(int)puVar39;
      puVar39 = (undefined1 *)((IVar18 << 0x20) + -0x100000000 >> 0x20);
      puVar44 = (undefined1 *)((IVar17 << 0x20) + -0x100000000 >> 0x20);
      puStack_105d0 = (undefined1 *)(1 - (long)puVar39);
      pDStack_10598 = (DoubleComplex *)(puVar56 + -1);
      bVar64 = false;
      uStack_10640 = 0;
      puStack_105f8 = puVar44;
      uStack_105c8 = puVar51;
      puStack_10588 = puVar39;
      puStack_10480 = puVar29;
      do {
        puVar48 = puVar22 + (long)puVar30;
        puVar61 = puVar22 + -1 + (long)puVar30;
        if ((long)puVar29 < (long)puVar48) {
          puVar61 = puVar29;
        }
        jdim = (Integer)(puVar61 + (1 - (long)puVar22));
        if ((char)iStack_105ec != '\0') {
          bVar64 = true;
        }
        if (-1 < (long)puVar51) {
          pDStack_105a0 = (DoubleComplex *)(puVar22 + bjlo);
          puStack_105b8 = puVar61 + bjlo;
          pDStack_105c0 = (DoubleComplex *)(puVar22 + cjlo);
          puStack_105a8 = puVar61 + cjlo;
          puVar22 = (undefined1 *)0x0;
          puStack_10540 = puVar48;
          do {
            puVar61 = puVar22 + (long)puVar59;
            puVar29 = puVar22 + -1 + (long)puVar59;
            if ((long)puVar51 < (long)puVar61) {
              puVar29 = puVar51;
            }
            kdim = (Integer)(puVar29 + (1 - (long)puVar22));
            if ((long)puVar39 <= (long)puVar44) {
              pDStack_105b0 = (DoubleComplex *)(puVar22 + bilo);
              bVar67 = false;
              puVar51 = puStack_105d0;
              do {
                puVar55 = puVar39 + (long)puVar56;
                puVar48 = puVar39 + (long)&pDStack_10598->real;
                if ((long)puVar44 < (long)puVar55) {
                  puVar48 = puVar44;
                }
                cdim = (Integer)(puVar48 + (long)puVar51);
                pDStack_10600 = (DoubleComplex *)(puVar39 + IStack_10580);
                puStack_105e0 = puVar48 + IStack_10580;
                if ((*pbStack_10568 | 0x20) == 0x6e) {
                  pIVar50 = &idim;
                  puVar44 = (undefined1 *)cdim;
                  jdim_1 = (Integer)pDStack_10600;
                  pDStack_10600 = (DoubleComplex *)(puVar22 + ajlo);
                  kdim_1 = (Integer)puStack_105e0;
                  puStack_105e0 = puVar29 + ajlo;
                }
                else {
                  pIVar50 = &kdim;
                  puVar44 = (undefined1 *)kdim;
                  jdim_1 = (Integer)(puVar22 + ajlo);
                  kdim_1 = (Integer)(puVar29 + ajlo);
                }
                idim = cdim;
                pnga_get(g_a,&jdim_1,&kdim_1,pDStack_10660,pIVar50);
                puVar32 = puStack_10578;
                if (!bVar67) {
                  pIVar50 = &kdim;
                  jdim_1 = (Integer)pDStack_105b0;
                  pDStack_10600 = pDStack_105a0;
                  kdim_1 = (Integer)(puVar29 + bilo);
                  puStack_105e0 = puStack_105b8;
                  if ((*pbStack_10570 | 0x20) != 0x6e) {
                    pIVar50 = &jdim;
                    jdim_1 = (Integer)pDStack_105a0;
                    pDStack_10600 = pDStack_105b0;
                    kdim_1 = (Integer)puStack_105b8;
                    puStack_105e0 = puVar29 + bilo;
                  }
                  uStack_10640 = *pIVar50;
                  pnga_get(g_b,&jdim_1,&kdim_1,pDStack_10650,pIVar50);
                }
                GAI_DGEMM((Integer)puVar32,(char *)pbStack_10568,(char *)pbStack_10570,idim,jdim,
                          kdim,alpha,pDStack_10660,(Integer)puVar44,pDStack_10650,uStack_10640,
                          (DoubleComplex *)cdim_prev,cdim);
                if (!bVar65) {
                  jdim_1 = (Integer)(puVar39 + cilo);
                  kdim_1 = (Integer)(puVar48 + cilo);
                  if ((puVar32 == (undefined1 *)0x3ee) || (puVar32 == (undefined1 *)0x3eb)) {
                    if (bVar64) goto LAB_0012a205;
                    pDVar52 = (DoubleComplex *)&ONE_CF;
                  }
                  else {
                    if (bVar64) {
LAB_0012a205:
                      puStack_105e0 = puStack_105a8;
                      pDStack_10600 = pDStack_105c0;
                      pnga_put(g_c,&jdim_1,&kdim_1,(void *)cdim_prev,&cdim);
                      goto LAB_0012a253;
                    }
                    pDVar52 = &ONE;
                  }
                  puStack_105e0 = puStack_105a8;
                  pDStack_10600 = pDStack_105c0;
                  pnga_acc(g_c,&jdim_1,&kdim_1,(void *)cdim_prev,&cdim,pDVar52);
                }
LAB_0012a253:
                puVar51 = puVar51 + -(long)puVar56;
                bVar67 = true;
                puVar39 = puVar55;
                puVar44 = puStack_105f8;
              } while ((long)puVar55 <= (long)puStack_105f8);
            }
            bVar64 = false;
            puVar22 = puVar61;
            puVar48 = puStack_10540;
            puVar29 = puStack_10480;
            puVar51 = uStack_105c8;
            puVar39 = puStack_10588;
          } while ((long)puVar61 <= (long)uStack_105c8);
        }
        puVar22 = puVar48;
      } while ((long)puVar48 <= (long)puVar29);
    }
    goto LAB_0012bc98;
  }
  if (!bVar65) {
    puStack_105d0 = (undefined1 *)0x0;
    pnga_nodeid();
    kdim_1 = 1;
    puStack_105e0 = (undefined1 *)0x1;
    cdim_prev = 1;
    pDStack_10550 = (DoubleComplex *)0x1;
    jdim = 0x3ff0000000000000;
    uStack_10420 = 0;
    IStack_103a0 = SUB168(ZEXT416(0x3f800000),0);
    ONE.real = (double)cilo;
    jdim_1 = cihi;
    ONE.imag = (double)cjlo;
    pDStack_10600 = (DoubleComplex *)cjhi;
    pnga_local_iterator_init(g_c,(_iterator_hdl *)ld);
    puStack_10540 = puVar56 + -1;
    uStack_105c8 = (undefined1 *)((ulong)uStack_105c8._4_4_ << 0x20);
    do {
      do {
        iVar12 = pnga_local_iterator_next
                           ((_iterator_hdl *)ld,&kdim_1,&cdim_prev,&pcStack_10348,&idim);
        if (iVar12 == 0) goto LAB_0012bc98;
        pnga_inquire(g_c,&ctype_1,&cndim,&kdim);
        lVar20 = pnga_patch_intersect((Integer *)&ONE,&jdim_1,&kdim_1,&cdim_prev,cndim);
      } while (lVar20 == 0);
      pDStack_10618 = (DoubleComplex *)0xffffffff;
      do {
        pDVar53 = pDStack_10550;
        IVar18 = cdim_prev;
        puVar22 = puStack_105e0;
        IVar17 = kdim_1;
        pDStack_105b0 = apDStack_104a8[0];
        c = pDVar52;
        lVar62 = (cdim_prev - kdim_1) + 1;
        iVar12 = ((int)(lVar62 / (long)puVar56) + 1) - (uint)(lVar62 % (long)puVar56 == 0);
        if (0x400 < iVar12) {
          pnga_error("Increase MAX_CHUNKS value in matmul.h",0);
        }
        puVar29 = puStack_10588;
        pDStack_10660 = (DoubleComplex *)(long)(int)pDStack_10618;
        if ((int)pDStack_10618 == -1) {
          pDStack_10660 = (DoubleComplex *)(puVar22 + -1);
        }
        puStack_10588 = (undefined1 *)((ulong)puStack_10588 & 0xffffffff00000000);
        iVar60 = 0;
        if ((long)pDStack_10660 < (long)pDVar53) {
          puStack_105f8 = (undefined1 *)(IVar17 + -1);
          uVar42 = (uint)((int)pDStack_10618 != -1);
          puStack_105a8 = (undefined1 *)(long)(int)puStack_105d0;
          iVar13 = 1 - (int)IVar17;
          pDStack_10598 = (DoubleComplex *)CONCAT44(pDStack_10598._4_4_,iVar13);
          iVar14 = (int)IVar17 + -1;
          pDStack_105a0 = (DoubleComplex *)CONCAT44(pDStack_105a0._4_4_,iVar14);
          puStack_105b8 = puStack_10540 + IVar17;
          iVar60 = 0;
          iVar107 = 0;
          puVar22 = (undefined1 *)0x0;
          do {
            pDStack_105c0 = (DoubleComplex *)(puVar30 + (long)&pDStack_10660->real);
            sVar45 = (short)uVar42;
            if (sVar45 != 0) {
              puVar22 = puStack_105a8;
            }
            if ((long)puVar22 <= (long)puVar39) {
              uVar42 = (uint)uStack_105c8;
              if (sVar45 == 0) {
                uVar42 = 1;
              }
              pDVar26 = pDVar53;
              if ((long)pDStack_105c0 < (long)pDVar53) {
                pDVar26 = pDStack_105c0;
              }
              iVar15 = (int)pDVar26 + -1;
              do {
                puVar44 = puVar22 + (long)puVar59;
                iVar112 = (int)puVar22;
                iVar100 = iVar112 + -1 + (int)puVar59;
                if ((long)puVar39 < (long)puVar44) {
                  iVar100 = (int)puVar39;
                }
                iVar16 = iVar12 + iVar60;
                if (0x3ff < iVar16) {
                  CYCLIC_DISTR_OPT_FLAG = '\x01';
                  if ((iVar60 != 1) || ((DIRECT_ACCESS_OPT_FLAG & 1) != 0)) {
                    puStack_10588._4_4_ = SUB84(puVar29,4);
                    puStack_10588 =
                         (undefined1 *)
                         CONCAT44(puStack_10588._4_4_,
                                  (int)CONCAT71((uint7)(uint3)((uint)iVar16 >> 8),1));
                    pDStack_10618 = (DoubleComplex *)((ulong)pDStack_10660 & 0xffffffff);
                    puStack_105d0 = puVar22;
                    uStack_105c8 = (undefined1 *)CONCAT44(uStack_105c8._4_4_,uVar42);
                    goto LAB_0012b632;
                  }
                  if ((((long)puVar56 <= cdim_prev - kdim_1) ||
                      ((long)puVar30 <= (long)pDStack_10550 - (long)puStack_105e0)) ||
                     ((long)puVar59 <= (long)puVar39)) {
                    pnga_error("Invalid task list",0);
                  }
                  pnga_access_ptr(g_c,&kdim_1,&cdim_prev,&c,&idim);
                  iVar60 = 1;
                  uVar41 = (undefined4)CONCAT71((int7)((ulong)IVar17 >> 8),1);
                  goto LAB_0012b588;
                }
                if (IVar17 <= IVar18) {
                  iVar46 = (iVar100 - iVar112) + 1;
                  pIVar50 = &irreg + (long)iVar60 * 4;
                  bVar65 = false;
                  puVar22 = puStack_105f8;
                  puVar51 = puStack_105b8;
                  iVar16 = iVar13;
                  iVar37 = iVar14;
                  do {
                    iVar54 = (int)IVar18;
                    iVar43 = (int)puVar51;
                    if (IVar18 < (long)puVar51) {
                      iVar43 = iVar54;
                    }
                    puVar22 = puVar22 + (long)puVar56;
                    if ((long)puVar22 < IVar18) {
                      iVar54 = (int)puVar22;
                    }
                    *(int *)(pIVar50 + 2) = iVar43 + iVar16;
                    *(int *)((long)pIVar50 + 0x14) = iVar46;
                    *(int *)pIVar50 = iVar37;
                    *(int *)(pIVar50 + 1) = iVar54 + -1;
                    *(int *)((long)pIVar50 + 4) = iVar112;
                    *(int *)((long)pIVar50 + 0xc) = iVar100;
                    *(short *)((long)pIVar50 + 0x1c) = (short)uVar42;
                    if (bVar65) {
                      iVar43 = (int)pIVar50[-1];
                    }
                    else {
                      lVar62 = (long)iVar107;
                      aiStack_10028[lVar62 * 8] = iVar46;
                      aiStack_10028[lVar62 * 8 + 1] = (iVar15 - (int)pDStack_10660) + 1;
                      *(int *)(hiC_1 + lVar62 * 4) = iVar112;
                      *(int *)(hiC_1 + lVar62 * 4 + 1) = iVar100;
                      *(int *)((long)hiC_1 + lVar62 * 0x20 + 4) = (int)pDStack_10660;
                      *(int *)((long)hiC_1 + lVar62 * 0x20 + 0xc) = iVar15;
                      iVar43 = iVar107;
                      iVar107 = iVar107 + 1;
                    }
                    *(int *)(pIVar50 + 3) = iVar43;
                    iVar60 = iVar60 + 1;
                    pIVar50 = pIVar50 + 4;
                    iVar37 = iVar37 + (int)puVar56;
                    iVar16 = iVar16 - (int)puVar56;
                    puVar51 = puVar51 + (long)puVar56;
                    bVar65 = true;
                  } while ((long)puVar22 < IVar18);
                }
                uVar42 = 0;
                puVar22 = puVar44;
              } while ((long)puVar44 <= (long)puVar39);
              puVar22 = (undefined1 *)0x0;
            }
            pDStack_10660 = pDStack_105c0;
          } while ((long)pDStack_105c0 < (long)pDVar53);
        }
        if (CYCLIC_DISTR_OPT_FLAG == '\0') {
          IVar19 = pnga_get_pgroup(g_a);
          uVar23 = pnga_pgroup_nodeid(IVar19);
          iVar12 = GA[g_a + 1000].nblock[0];
          uVar23 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
          iVar107 = GA[g_a + 1000].nblock[1];
          if (IVar17 <= IVar18) {
            puVar22 = puStack_10540 + IVar17;
            puVar29 = puVar22;
            if ((long)puVar22 < IVar18) {
              puVar29 = (undefined1 *)IVar18;
            }
            uVar24 = (ulong)(puVar29 + (1 - (long)(puVar56 + IVar17)) != (undefined1 *)0x0);
            uVar27 = ((long)(puVar29 + (1 - (long)(puVar56 + IVar17))) - uVar24) / (ulong)puVar56;
            lVar62 = uVar24 + uVar27;
            auVar70._8_4_ = (int)lVar62;
            auVar70._0_8_ = lVar62;
            auVar70._12_4_ = (int)((ulong)lVar62 >> 0x20);
            uVar27 = uVar27 + uVar24 + 8 & 0xfffffffffffffff8;
            auVar70 = auVar70 ^ _DAT_001b1c20;
            puVar35 = local_7f3c;
            auVar90 = _DAT_001b1c10;
            auVar116 = _DAT_001b1c00;
            auVar94 = _DAT_001b4f90;
            auVar95 = _DAT_001b4f80;
            do {
              auVar76 = auVar90 ^ _DAT_001b1c20;
              iVar13 = auVar70._0_4_;
              iVar100 = -(uint)(iVar13 < auVar76._0_4_);
              iVar14 = auVar70._4_4_;
              auVar77._4_4_ = -(uint)(iVar14 < auVar76._4_4_);
              iVar15 = auVar70._8_4_;
              iVar16 = -(uint)(iVar15 < auVar76._8_4_);
              iVar112 = auVar70._12_4_;
              auVar77._12_4_ = -(uint)(iVar112 < auVar76._12_4_);
              auVar86._4_4_ = iVar100;
              auVar86._0_4_ = iVar100;
              auVar86._8_4_ = iVar16;
              auVar86._12_4_ = iVar16;
              auVar108 = pshuflw(in_XMM8,auVar86,0xe8);
              auVar79._4_4_ = -(uint)(auVar76._4_4_ == iVar14);
              auVar79._12_4_ = -(uint)(auVar76._12_4_ == iVar112);
              auVar79._0_4_ = auVar79._4_4_;
              auVar79._8_4_ = auVar79._12_4_;
              auVar113 = pshuflw(in_XMM9,auVar79,0xe8);
              auVar77._0_4_ = auVar77._4_4_;
              auVar77._8_4_ = auVar77._12_4_;
              auVar76 = pshuflw(auVar108,auVar77,0xe8);
              auVar109._8_4_ = 0xffffffff;
              auVar109._0_8_ = 0xffffffffffffffff;
              auVar109._12_4_ = 0xffffffff;
              auVar109 = (auVar76 | auVar113 & auVar108) ^ auVar109;
              auVar76 = packssdw(auVar109,auVar109);
              if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar35[-0x70] = 0;
              }
              auVar77 = auVar79 & auVar86 | auVar77;
              auVar76 = packssdw(auVar77,auVar77);
              auVar4._8_4_ = 0xffffffff;
              auVar4._0_8_ = 0xffffffffffffffff;
              auVar4._12_4_ = 0xffffffff;
              auVar76 = packssdw(auVar76 ^ auVar4,auVar76 ^ auVar4);
              if ((auVar76._0_4_ >> 0x10 & 1) != 0) {
                puVar35[-0x60] = 0;
              }
              auVar76 = auVar116 ^ _DAT_001b1c20;
              iVar100 = -(uint)(iVar13 < auVar76._0_4_);
              auVar101._4_4_ = -(uint)(iVar14 < auVar76._4_4_);
              iVar16 = -(uint)(iVar15 < auVar76._8_4_);
              auVar101._12_4_ = -(uint)(iVar112 < auVar76._12_4_);
              auVar78._4_4_ = iVar100;
              auVar78._0_4_ = iVar100;
              auVar78._8_4_ = iVar16;
              auVar78._12_4_ = iVar16;
              auVar87._4_4_ = -(uint)(auVar76._4_4_ == iVar14);
              auVar87._12_4_ = -(uint)(auVar76._12_4_ == iVar112);
              auVar87._0_4_ = auVar87._4_4_;
              auVar87._8_4_ = auVar87._12_4_;
              auVar101._0_4_ = auVar101._4_4_;
              auVar101._8_4_ = auVar101._12_4_;
              auVar76 = auVar87 & auVar78 | auVar101;
              auVar76 = packssdw(auVar76,auVar76);
              auVar5._8_4_ = 0xffffffff;
              auVar5._0_8_ = 0xffffffffffffffff;
              auVar5._12_4_ = 0xffffffff;
              auVar76 = packssdw(auVar76 ^ auVar5,auVar76 ^ auVar5);
              if ((auVar76 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar35[-0x50] = 0;
              }
              auVar109 = pshufhw(auVar78,auVar78,0x84);
              auVar77 = pshufhw(auVar87,auVar87,0x84);
              auVar79 = pshufhw(auVar109,auVar101,0x84);
              auVar80._8_4_ = 0xffffffff;
              auVar80._0_8_ = 0xffffffffffffffff;
              auVar80._12_4_ = 0xffffffff;
              auVar80 = (auVar79 | auVar77 & auVar109) ^ auVar80;
              auVar109 = packssdw(auVar80,auVar80);
              if ((auVar109 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar35[-0x40] = 0;
              }
              auVar109 = auVar94 ^ _DAT_001b1c20;
              iVar100 = -(uint)(iVar13 < auVar109._0_4_);
              auVar82._4_4_ = -(uint)(iVar14 < auVar109._4_4_);
              iVar16 = -(uint)(iVar15 < auVar109._8_4_);
              auVar82._12_4_ = -(uint)(iVar112 < auVar109._12_4_);
              auVar88._4_4_ = iVar100;
              auVar88._0_4_ = iVar100;
              auVar88._8_4_ = iVar16;
              auVar88._12_4_ = iVar16;
              auVar76 = pshuflw(auVar76,auVar88,0xe8);
              auVar81._4_4_ = -(uint)(auVar109._4_4_ == iVar14);
              auVar81._12_4_ = -(uint)(auVar109._12_4_ == iVar112);
              auVar81._0_4_ = auVar81._4_4_;
              auVar81._8_4_ = auVar81._12_4_;
              in_XMM9 = pshuflw(auVar113 & auVar108,auVar81,0xe8);
              in_XMM9 = in_XMM9 & auVar76;
              auVar82._0_4_ = auVar82._4_4_;
              auVar82._8_4_ = auVar82._12_4_;
              auVar76 = pshuflw(auVar76,auVar82,0xe8);
              auVar108._8_4_ = 0xffffffff;
              auVar108._0_8_ = 0xffffffffffffffff;
              auVar108._12_4_ = 0xffffffff;
              auVar108 = (auVar76 | in_XMM9) ^ auVar108;
              auVar76 = packssdw(auVar108,auVar108);
              if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar35[-0x30] = 0;
              }
              auVar82 = auVar81 & auVar88 | auVar82;
              auVar76 = packssdw(auVar82,auVar82);
              auVar113._8_4_ = 0xffffffff;
              auVar113._0_8_ = 0xffffffffffffffff;
              auVar113._12_4_ = 0xffffffff;
              auVar76 = packssdw(auVar76 ^ auVar113,auVar76 ^ auVar113);
              if ((auVar76 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar35[-0x20] = 0;
              }
              auVar76 = auVar95 ^ _DAT_001b1c20;
              iVar13 = -(uint)(iVar13 < auVar76._0_4_);
              auVar102._4_4_ = -(uint)(iVar14 < auVar76._4_4_);
              iVar15 = -(uint)(iVar15 < auVar76._8_4_);
              auVar102._12_4_ = -(uint)(iVar112 < auVar76._12_4_);
              auVar83._4_4_ = iVar13;
              auVar83._0_4_ = iVar13;
              auVar83._8_4_ = iVar15;
              auVar83._12_4_ = iVar15;
              auVar89._4_4_ = -(uint)(auVar76._4_4_ == iVar14);
              auVar89._12_4_ = -(uint)(auVar76._12_4_ == iVar112);
              auVar89._0_4_ = auVar89._4_4_;
              auVar89._8_4_ = auVar89._12_4_;
              auVar102._0_4_ = auVar102._4_4_;
              auVar102._8_4_ = auVar102._12_4_;
              auVar76 = auVar89 & auVar83 | auVar102;
              auVar76 = packssdw(auVar76,auVar76);
              auVar6._8_4_ = 0xffffffff;
              auVar6._0_8_ = 0xffffffffffffffff;
              auVar6._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar76 ^ auVar6,auVar76 ^ auVar6);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar35[-0x10] = 0;
              }
              auVar76 = pshufhw(auVar83,auVar83,0x84);
              auVar79 = pshufhw(auVar89,auVar89,0x84);
              auVar109 = pshufhw(auVar76,auVar102,0x84);
              auVar84._8_4_ = 0xffffffff;
              auVar84._0_8_ = 0xffffffffffffffff;
              auVar84._12_4_ = 0xffffffff;
              auVar84 = (auVar109 | auVar79 & auVar76) ^ auVar84;
              auVar76 = packssdw(auVar84,auVar84);
              if ((auVar76 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *puVar35 = 0;
              }
              lVar62 = auVar90._8_8_;
              auVar90._0_8_ = auVar90._0_8_ + 8;
              auVar90._8_8_ = lVar62 + 8;
              lVar62 = auVar116._8_8_;
              auVar116._0_8_ = auVar116._0_8_ + 8;
              auVar116._8_8_ = lVar62 + 8;
              lVar62 = auVar94._8_8_;
              auVar94._0_8_ = auVar94._0_8_ + 8;
              auVar94._8_8_ = lVar62 + 8;
              lVar62 = auVar95._8_8_;
              auVar95._0_8_ = auVar95._0_8_ + 8;
              auVar95._8_8_ = lVar62 + 8;
              puVar35 = puVar35 + 0x80;
              uVar27 = uVar27 - 8;
            } while (uVar27 != 0);
            if ((long)puVar22 < IVar18) {
              puVar22 = (undefined1 *)IVar18;
            }
            uVar24 = (ulong)(puVar22 + (1 - (long)(puVar56 + IVar17)) != (undefined1 *)0x0);
            uVar27 = ((long)(puVar22 + (1 - (long)(puVar56 + IVar17))) - uVar24) / (ulong)puVar56;
            lVar62 = uVar24 + uVar27;
            auVar71._8_4_ = (int)lVar62;
            auVar71._0_8_ = lVar62;
            auVar71._12_4_ = (int)((ulong)lVar62 >> 0x20);
            puVar35 = local_7f3c +
                      (long)(((int)((long)uVar23 / (long)iVar12) +
                             (int)((long)uVar23 % (long)iVar12)) % iVar107) * 0x10;
            uVar23 = uVar27 + uVar24 + 8 & 0xfffffffffffffff8;
            auVar72 = _DAT_001b1c10;
            auVar73 = _DAT_001b1c00;
            auVar74 = _DAT_001b4f90;
            auVar75 = _DAT_001b4f80;
            do {
              auVar76 = auVar71 ^ _DAT_001b1c20;
              auVar90 = auVar72 ^ _DAT_001b1c20;
              iVar12 = auVar76._0_4_;
              iVar15 = -(uint)(iVar12 < auVar90._0_4_);
              iVar107 = auVar76._4_4_;
              auVar92._4_4_ = -(uint)(iVar107 < auVar90._4_4_);
              iVar13 = auVar76._8_4_;
              iVar112 = -(uint)(iVar13 < auVar90._8_4_);
              iVar14 = auVar76._12_4_;
              auVar92._12_4_ = -(uint)(iVar14 < auVar90._12_4_);
              auVar103._4_4_ = iVar15;
              auVar103._0_4_ = iVar15;
              auVar103._8_4_ = iVar112;
              auVar103._12_4_ = iVar112;
              auVar76 = pshuflw(in_XMM9,auVar103,0xe8);
              auVar91._4_4_ = -(uint)(auVar90._4_4_ == iVar107);
              auVar91._12_4_ = -(uint)(auVar90._12_4_ == iVar14);
              auVar91._0_4_ = auVar91._4_4_;
              auVar91._8_4_ = auVar91._12_4_;
              auVar116 = pshuflw(in_XMM10,auVar91,0xe8);
              auVar92._0_4_ = auVar92._4_4_;
              auVar92._8_4_ = auVar92._12_4_;
              auVar90 = pshuflw(auVar76,auVar92,0xe8);
              auVar114._8_4_ = 0xffffffff;
              auVar114._0_8_ = 0xffffffffffffffff;
              auVar114._12_4_ = 0xffffffff;
              auVar114 = (auVar90 | auVar116 & auVar76) ^ auVar114;
              auVar90 = packssdw(auVar114,auVar114);
              if ((auVar90 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar35[-0x70] = 1;
              }
              auVar92 = auVar91 & auVar103 | auVar92;
              auVar90 = packssdw(auVar92,auVar92);
              auVar7._8_4_ = 0xffffffff;
              auVar7._0_8_ = 0xffffffffffffffff;
              auVar7._12_4_ = 0xffffffff;
              auVar90 = packssdw(auVar90 ^ auVar7,auVar90 ^ auVar7);
              if ((auVar90._0_4_ >> 0x10 & 1) != 0) {
                puVar35[-0x60] = 1;
              }
              auVar90 = auVar73 ^ _DAT_001b1c20;
              iVar15 = -(uint)(iVar12 < auVar90._0_4_);
              auVar110._4_4_ = -(uint)(iVar107 < auVar90._4_4_);
              iVar112 = -(uint)(iVar13 < auVar90._8_4_);
              auVar110._12_4_ = -(uint)(iVar14 < auVar90._12_4_);
              auVar93._4_4_ = iVar15;
              auVar93._0_4_ = iVar15;
              auVar93._8_4_ = iVar112;
              auVar93._12_4_ = iVar112;
              auVar104._4_4_ = -(uint)(auVar90._4_4_ == iVar107);
              auVar104._12_4_ = -(uint)(auVar90._12_4_ == iVar14);
              auVar104._0_4_ = auVar104._4_4_;
              auVar104._8_4_ = auVar104._12_4_;
              auVar110._0_4_ = auVar110._4_4_;
              auVar110._8_4_ = auVar110._12_4_;
              auVar90 = auVar104 & auVar93 | auVar110;
              auVar90 = packssdw(auVar90,auVar90);
              auVar8._8_4_ = 0xffffffff;
              auVar8._0_8_ = 0xffffffffffffffff;
              auVar8._12_4_ = 0xffffffff;
              auVar90 = packssdw(auVar90 ^ auVar8,auVar90 ^ auVar8);
              if ((auVar90 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar35[-0x50] = 1;
              }
              auVar94 = pshufhw(auVar93,auVar93,0x84);
              auVar70 = pshufhw(auVar104,auVar104,0x84);
              auVar95 = pshufhw(auVar94,auVar110,0x84);
              auVar96._8_4_ = 0xffffffff;
              auVar96._0_8_ = 0xffffffffffffffff;
              auVar96._12_4_ = 0xffffffff;
              auVar96 = (auVar95 | auVar70 & auVar94) ^ auVar96;
              auVar94 = packssdw(auVar96,auVar96);
              if ((auVar94 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                puVar35[-0x40] = 1;
              }
              auVar94 = auVar74 ^ _DAT_001b1c20;
              iVar15 = -(uint)(iVar12 < auVar94._0_4_);
              auVar98._4_4_ = -(uint)(iVar107 < auVar94._4_4_);
              iVar112 = -(uint)(iVar13 < auVar94._8_4_);
              auVar98._12_4_ = -(uint)(iVar14 < auVar94._12_4_);
              auVar105._4_4_ = iVar15;
              auVar105._0_4_ = iVar15;
              auVar105._8_4_ = iVar112;
              auVar105._12_4_ = iVar112;
              auVar90 = pshuflw(auVar90,auVar105,0xe8);
              auVar97._4_4_ = -(uint)(auVar94._4_4_ == iVar107);
              auVar97._12_4_ = -(uint)(auVar94._12_4_ == iVar14);
              auVar97._0_4_ = auVar97._4_4_;
              auVar97._8_4_ = auVar97._12_4_;
              in_XMM10 = pshuflw(auVar116 & auVar76,auVar97,0xe8);
              in_XMM10 = in_XMM10 & auVar90;
              auVar98._0_4_ = auVar98._4_4_;
              auVar98._8_4_ = auVar98._12_4_;
              auVar76 = pshuflw(auVar90,auVar98,0xe8);
              auVar115._8_4_ = 0xffffffff;
              auVar115._0_8_ = 0xffffffffffffffff;
              auVar115._12_4_ = 0xffffffff;
              auVar115 = (auVar76 | in_XMM10) ^ auVar115;
              auVar76 = packssdw(auVar115,auVar115);
              if ((auVar76 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
                puVar35[-0x30] = 1;
              }
              auVar98 = auVar97 & auVar105 | auVar98;
              auVar76 = packssdw(auVar98,auVar98);
              auVar9._8_4_ = 0xffffffff;
              auVar9._0_8_ = 0xffffffffffffffff;
              auVar9._12_4_ = 0xffffffff;
              auVar76 = packssdw(auVar76 ^ auVar9,auVar76 ^ auVar9);
              if ((auVar76 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
                puVar35[-0x20] = 1;
              }
              auVar76 = auVar75 ^ _DAT_001b1c20;
              auVar111._0_4_ = -(uint)(iVar12 < auVar76._0_4_);
              auVar111._4_4_ = -(uint)(iVar107 < auVar76._4_4_);
              auVar111._8_4_ = -(uint)(iVar13 < auVar76._8_4_);
              auVar111._12_4_ = -(uint)(iVar14 < auVar76._12_4_);
              auVar99._4_4_ = auVar111._0_4_;
              auVar99._0_4_ = auVar111._0_4_;
              auVar99._8_4_ = auVar111._8_4_;
              auVar99._12_4_ = auVar111._8_4_;
              iVar12 = -(uint)(auVar76._4_4_ == iVar107);
              iVar107 = -(uint)(auVar76._12_4_ == iVar14);
              auVar85._4_4_ = iVar12;
              auVar85._0_4_ = iVar12;
              auVar85._8_4_ = iVar107;
              auVar85._12_4_ = iVar107;
              auVar106._4_4_ = auVar111._4_4_;
              auVar106._0_4_ = auVar111._4_4_;
              auVar106._8_4_ = auVar111._12_4_;
              auVar106._12_4_ = auVar111._12_4_;
              in_XMM9 = auVar85 & auVar99 | auVar106;
              auVar76 = packssdw(auVar111,in_XMM9);
              auVar10._8_4_ = 0xffffffff;
              auVar10._0_8_ = 0xffffffffffffffff;
              auVar10._12_4_ = 0xffffffff;
              in_XMM8 = packssdw(auVar76 ^ auVar10,auVar76 ^ auVar10);
              if ((in_XMM8 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
                puVar35[-0x10] = 1;
              }
              auVar90 = pshufhw(auVar99,auVar99,0x84);
              auVar76 = pshufhw(auVar85,auVar85,0x84);
              auVar116 = pshufhw(auVar90,auVar106,0x84);
              auVar11._8_4_ = 0xffffffff;
              auVar11._0_8_ = 0xffffffffffffffff;
              auVar11._12_4_ = 0xffffffff;
              auVar76 = packssdw(auVar76 & auVar90,(auVar116 | auVar76 & auVar90) ^ auVar11);
              if ((auVar76 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
                *puVar35 = 1;
              }
              lVar62 = auVar72._8_8_;
              auVar72._0_8_ = auVar72._0_8_ + 8;
              auVar72._8_8_ = lVar62 + 8;
              lVar62 = auVar73._8_8_;
              auVar73._0_8_ = auVar73._0_8_ + 8;
              auVar73._8_8_ = lVar62 + 8;
              lVar62 = auVar74._8_8_;
              auVar74._0_8_ = auVar74._0_8_ + 8;
              auVar74._8_8_ = lVar62 + 8;
              lVar62 = auVar75._8_8_;
              auVar75._0_8_ = auVar75._0_8_ + 8;
              auVar75._8_8_ = lVar62 + 8;
              puVar35 = puVar35 + 0x80;
              uVar23 = uVar23 - 8;
            } while (uVar23 != 0);
          }
          uVar41 = 0;
          pDStack_10660 = pDStack_10618;
          puVar22 = puStack_105d0;
          uVar42 = (uint)uStack_105c8;
LAB_0012b588:
          puVar29 = (undefined1 *)0x0;
          puStack_10588 = (undefined1 *)CONCAT44(puStack_10588._4_4_,uVar41);
          if (CYCLIC_DISTR_OPT_FLAG == '\0') {
            IVar17 = pnga_get_pgroup(g_a);
            uVar23 = pnga_pgroup_nodeid(IVar17);
            uVar23 = (ulong)(uint)((int)uVar23 >> 0x1f) << 0x20 | uVar23 & 0xffffffff;
            puVar29 = (undefined1 *)
                      ((long)((int)((long)uVar23 / (long)GA[g_a + 1000].nblock[0]) +
                             (int)((long)uVar23 % (long)GA[g_a + 1000].nblock[0])) %
                       (long)GA[g_a + 1000].nblock[1] & 0xffffffff);
            puStack_105d0 = puVar22;
          }
          else {
            puStack_105d0 = puVar22;
          }
          pDStack_10618 = (DoubleComplex *)((ulong)pDStack_10660 & 0xffffffff);
          uStack_105c8 = (undefined1 *)CONCAT44(uStack_105c8._4_4_,uVar42);
          puStack_105d0 = puVar22;
        }
        else {
LAB_0012b632:
          uVar41 = 0;
          puVar29 = (undefined1 *)0x0;
        }
        iVar12 = (int)puVar29;
        puStack_105a8 = puVar29;
        if (iVar12 < iVar60) {
          uVar42 = local_801c[(long)iVar12 * 8 + -1];
          GET_BLOCK(g_a,(task_list_t *)(&irreg + (long)iVar12 * 4),a_ar[0],
                    (char *)(ulong)*pbStack_10568,IStack_10580,ajlo,(Integer *)&ONE_CF,gNbhdlA);
          pDStack_105a0 = (DoubleComplex *)(long)(int)uVar42;
          GET_BLOCK(g_b,(task_list_t *)(hiC_1 + (long)(int)uVar42 * 4),pDStack_105b0,
                    (char *)(ulong)*pbStack_10570,bilo,bjlo,&bdim_next,gNbhdlB);
          uVar42 = 0;
          bVar65 = true;
          uVar58 = 1;
          puStack_105b8 = (undefined1 *)0x0;
          pDStack_105c0 = (DoubleComplex *)((ulong)pDStack_105c0 & 0xffffffff00000000);
          do {
            IVar17 = bdim_next;
            adim = ONE_CF;
            lVar62 = (long)(int)puVar29;
            uVar2 = local_801c[lVar62 * 8 + -1];
            iVar12 = aiStack_8030[lVar62 * 8 + 2];
            lVar57 = (long)(int)uVar2 * 0x20;
            iVar107 = aiStack_10028[(long)(int)uVar2 * 8 + 1];
            puStack_105f8 = (undefined1 *)(long)(int)local_801c[lVar62 * 8 + -2];
            if ((char)iStack_105ec != '\0') {
              pDStack_105c0 =
                   (DoubleComplex *)
                   CONCAT44(pDStack_105c0._4_4_,(uint)(ushort)local_801c[lVar62 * 8]);
            }
            uVar31 = uVar58;
            if ((CYCLIC_DISTR_OPT_FLAG == '\0') && ((int)uVar58 < iVar60)) {
              uVar31 = (int)((int)puStack_105a8 + uVar58) % iVar60;
            }
            pDStack_10598 = a_ar[uVar42];
            cdim = (long)iVar12;
            pnga_nbwait(gNbhdlA + uVar42);
            if (bVar65) {
              pDStack_105b0 = apDStack_104a8[(ulong)puStack_105b8 & 0xffffffff];
              pnga_nbwait(gNbhdlB + ((ulong)puStack_105b8 & 0xffffffff));
            }
            if ((int)uVar31 < iVar60) {
              GET_BLOCK(g_a,(task_list_t *)(&irreg + (long)(int)uVar31 * 4),a_ar[uVar42 ^ 1],
                        (char *)(ulong)*pbStack_10568,IStack_10580,ajlo,(Integer *)&ONE_CF,
                        gNbhdlA + (uVar42 ^ 1));
              uVar3 = local_801c[(long)(int)uVar31 * 8 + -1];
              if (uVar2 == uVar3) {
                pDStack_105a0 = (DoubleComplex *)(ulong)uVar2;
              }
              else {
                uVar28 = ~(uint)puStack_105b8 & 1;
                puStack_105b8 = (undefined1 *)(ulong)uVar28;
                uVar23 = (ulong)(uVar28 * 8);
                GET_BLOCK(g_b,(task_list_t *)(hiC_1 + (long)(int)uVar3 * 4),
                          *(void **)((long)apDStack_104a8 + uVar23),(char *)(ulong)*pbStack_10570,
                          bilo,bjlo,&bdim_next,(Integer *)((long)gNbhdlB + uVar23));
                pDStack_105a0 = (DoubleComplex *)(ulong)uVar3;
              }
            }
            bVar65 = uVar2 != (uint)pDStack_105a0;
            GAI_DGEMM((Integer)puStack_10578,(char *)pbStack_10568,(char *)pbStack_10570,
                      (long)iVar12,(long)iVar107,(Integer)puStack_105f8,alpha,pDStack_10598,
                      (Integer)adim,pDStack_105b0,IVar17,c,cdim);
            cStack_10620 = (char)uVar41;
            if (cStack_10620 == '\0') {
              ONE.real = (double)((int)(&irreg)[lVar62 * 4] + cilo);
              jdim_1 = aiStack_8030[lVar62 * 8] + cilo;
              ONE.imag = (double)(*(int *)((long)hiC_1 + lVar57 + 4) + cjlo);
              pDStack_10600 = (DoubleComplex *)(*(int *)((long)hiC_1 + lVar57 + 0xc) + cjlo);
              if ((puStack_10578 == (undefined1 *)0x3ee) || (puStack_10578 == (undefined1 *)0x3eb))
              {
                if ((short)pDStack_105c0 == 1) goto LAB_0012ba68;
                pIVar50 = &IStack_103a0;
              }
              else {
                if ((short)pDStack_105c0 == 1) {
LAB_0012ba68:
                  pnga_put(g_c,(Integer *)&ONE,&jdim_1,c,&cdim);
                  goto LAB_0012bab6;
                }
                pIVar50 = &jdim;
              }
              pnga_acc(g_c,(Integer *)&ONE,&jdim_1,c,&cdim,pIVar50);
            }
LAB_0012bab6:
            uVar42 = ~uVar42 & 1;
            uVar58 = uVar58 + 1;
            puVar29 = (undefined1 *)(ulong)uVar31;
          } while ((int)uVar31 < iVar60);
        }
      } while ((char)puStack_10588 != '\0');
    } while( true );
  }
  IVar17 = pnga_nnodes();
  cdim_prev = 0;
  IVar18 = pnga_get_pgroup(g_a);
  irreg = 0x3ff0000000000000;
  aiStack_8030[0] = 0;
  aiStack_8030[1] = 0;
  idim = SUB168(ZEXT416(0x3f800000),0);
  IVar18 = pnga_pgroup_nodeid(IVar18);
  hiC_1[0] = cilo;
  hiC_1[1] = cjlo;
  ld[0] = cihi;
  ld[1] = cjhi;
  if ((char)iStack_105ec != '\0') {
    pnga_fill_patch(g_c,hiC_1,ld,beta);
  }
  if ((long)puVar22 < 0) goto LAB_0012bc98;
  uStack_10640 = 0;
  pIStack_10450 = &idim;
  uStack_10658 = 0;
  pDStack_10598 = (DoubleComplex *)0x0;
  puVar61 = (undefined1 *)0x0;
  pDVar53 = (DoubleComplex *)0x0;
  puVar48 = (undefined1 *)0x0;
  lStack_10648 = 0;
  puStack_105f8 = (undefined1 *)0x0;
  uStack_105c8 = (undefined1 *)0x0;
  lVar62 = 0;
  pDStack_105c0 = (DoubleComplex *)((ulong)pDStack_105c0 & 0xffffffff00000000);
  iVar12 = 0;
  puVar51 = (undefined1 *)0x0;
  puStack_105b8 = (undefined1 *)((ulong)puStack_105b8 & 0xffffffff00000000);
  pDStack_105a0 = (DoubleComplex *)((ulong)pDStack_105a0 & 0xffffffff00000000);
  puVar44 = (undefined1 *)0x0;
  do {
    puVar55 = puVar44 + (long)puVar30;
    puVar32 = puVar44 + -1 + (long)puVar30;
    if ((long)puVar22 < (long)puVar55) {
      puVar32 = puVar22;
    }
    jdim_1 = (Integer)(puVar32 + (1 - (long)puVar44));
    if (-1 < (long)puVar39) {
      puStack_10480 = puVar44;
      puStack_10440 = puVar44 + bjlo;
      puStack_10488 = puVar32;
      puStack_10448 = puVar32 + bjlo;
      puVar44 = (undefined1 *)0x0;
      do {
        puVar25 = puVar44 + (long)puVar59;
        puVar32 = puVar44 + -1 + (long)puVar59;
        if ((long)puVar39 < (long)puVar25) {
          puVar32 = puVar39;
        }
        pDStack_10630 = (DoubleComplex *)(puVar32 + (1 - (long)puVar44));
        kdim_1 = (Integer)pDStack_10630;
        if (-1 < (long)puVar29) {
          puStack_105d0 = puVar44 + ajlo;
          puStack_10540 = puVar32 + ajlo;
          lVar57 = 1;
          iVar60 = 1;
          pDVar26 = pDVar53;
          puVar63 = (undefined1 *)0x0;
          do {
            puVar1 = puVar63 + (long)puVar56;
            pDVar53 = pDVar26;
            if (lVar62 % IVar17 == IVar18) {
              puVar40 = puVar56 + -1 + (long)puVar63;
              if ((long)puVar29 < (long)puVar1) {
                puVar40 = puVar29;
              }
              pDStack_105b0 = (DoubleComplex *)(puVar40 + lVar57);
              iStack_105ec = (int)puVar51;
              if ((*pbStack_10568 | 0x20) == 0x6e) {
                pDVar49 = &ONE;
                hiC_1[0] = (Integer)(puVar63 + IStack_10580);
                hiC_1[1] = (Integer)puStack_105d0;
                ld[0] = (Integer)(puVar40 + IStack_10580);
                ld[1] = (Integer)puStack_10540;
                pDStack_10630 = pDStack_105b0;
              }
              else {
                hiC_1[1] = (Integer)(puVar63 + IStack_10580);
                ld[1] = (Integer)(puVar40 + IStack_10580);
                pDVar49 = (DoubleComplex *)&kdim_1;
                hiC_1[0] = (Integer)puStack_105d0;
                ld[0] = (Integer)puStack_10540;
              }
              pDVar53 = pDStack_10630;
              puStack_105a8 = puVar48;
              puStack_10588 = puVar61;
              ONE.real = (double)pDStack_105b0;
              pnga_nbget(g_a,hiC_1,ld,a_ar[uStack_10658],(Integer *)pDVar49,gNbhdlA + uStack_10658);
              if (iVar60 != 0) {
                pIVar50 = &kdim_1;
                hiC_1[0] = (Integer)(puVar44 + bilo);
                hiC_1[1] = (Integer)puStack_10440;
                ld[0] = (Integer)(puVar32 + bilo);
                ld[1] = (Integer)puStack_10448;
                if ((*pbStack_10570 | 0x20) != 0x6e) {
                  pIVar50 = &jdim_1;
                  hiC_1[0] = (Integer)puStack_10440;
                  hiC_1[1] = (Integer)(puVar44 + bilo);
                  ld[0] = (Integer)puStack_10448;
                  ld[1] = (Integer)(puVar32 + bilo);
                }
                uStack_105c8 = (undefined1 *)*pIVar50;
                pnga_nbget(g_b,hiC_1,ld,apDStack_104a8[uStack_10640],pIVar50,gNbhdlB + uStack_10640)
                ;
              }
              if ((short)pDStack_10598 != 0) {
                lVar33 = (long)puStack_105f8 * lStack_10648;
                if (puStack_10578 == (undefined1 *)0x3eb) {
                  if (0 < lVar33) {
                    sVar34 = lVar33 * 4;
                    goto LAB_0012a789;
                  }
                }
                else if ((puStack_10578 == (undefined1 *)0x3ec) ||
                        (puStack_10578 == (undefined1 *)0x3ee)) {
                  if (0 < lVar33) {
                    sVar34 = lVar33 * 8;
                    goto LAB_0012a789;
                  }
                }
                else if (0 < lVar33) {
                  sVar34 = lVar33 * 0x10;
LAB_0012a789:
                  memset(pDVar52,0,sVar34);
                }
                uVar23 = (ulong)(((uint)uStack_10658 ^ 1) << 3);
                pDVar49 = *(DoubleComplex **)((long)a_ar + uVar23);
                pnga_nbwait((Integer *)((long)gNbhdlA + uVar23));
                if ((int)pDStack_105c0 != 0) {
                  uVar23 = (ulong)(((uint)uStack_10640 ^ 1) << 3);
                  pDStack_10650 = *(DoubleComplex **)((long)apDStack_104a8 + uVar23);
                  pnga_nbwait((Integer *)((long)gNbhdlB + uVar23));
                }
                puVar51 = puStack_10578;
                GAI_DGEMM((Integer)puStack_10578,(char *)pbStack_10568,(char *)pbStack_10570,
                          (Integer)puStack_105f8,lStack_10648,(Integer)puStack_105a8,alpha,pDVar49,
                          (Integer)pDVar26,pDStack_10650,(Integer)puStack_10588,pDVar52,cdim_prev);
                hiC_1[0] = iVar12 + cilo;
                ld[0] = (int)puStack_105b8 + cilo;
                hiC_1[1] = (int)pDStack_105a0 + cjlo;
                ld[1] = iStack_105ec + cjlo;
                if ((puVar51 == (undefined1 *)0x3ee) || (puVar51 == (undefined1 *)0x3eb)) {
                  pIVar50 = &idim;
                }
                else {
                  pIVar50 = &irreg;
                }
                pnga_acc(g_c,hiC_1,ld,pDVar52,&cdim_prev,pIVar50);
              }
              uStack_10658 = (ulong)((uint)uStack_10658 ^ 1);
              puStack_105f8 = (undefined1 *)ONE.real;
              lStack_10648 = jdim_1;
              cdim_prev = (Integer)pDStack_105b0;
              uStack_10640 = (ulong)((uint)uStack_10640 ^ (uint)(iVar60 != 0));
              pDStack_10598 = (DoubleComplex *)0x1;
              pDStack_105a0 = (DoubleComplex *)CONCAT44(pDStack_105a0._4_4_,(int)puStack_10480);
              puStack_105b8 = (undefined1 *)CONCAT44(puStack_105b8._4_4_,(int)puVar40);
              iVar12 = (int)puVar63;
              pDStack_105c0 = (DoubleComplex *)CONCAT44(pDStack_105c0._4_4_,iVar60);
              iVar60 = 0;
              pDStack_10630 = (DoubleComplex *)kdim_1;
              puVar51 = puStack_10488;
              puVar48 = (undefined1 *)kdim_1;
              puVar61 = uStack_105c8;
            }
            lVar62 = lVar62 + 1;
            lVar57 = lVar57 - (long)puVar56;
            pDVar26 = pDVar53;
            puVar63 = puVar1;
          } while ((long)puVar1 <= (long)puVar29);
        }
        puVar44 = puVar25;
      } while ((long)puVar25 <= (long)puVar39);
    }
    puVar44 = puVar55;
  } while ((long)puVar55 <= (long)puVar22);
  if ((short)pDStack_10598 == 0) goto LAB_0012bc98;
  lVar62 = lStack_10648 * (long)puStack_105f8;
  puStack_105a8 = puVar48;
  puStack_10588 = puVar61;
  if (puStack_10578 == (undefined1 *)0x3eb) {
    if (0 < lVar62) {
      sVar34 = lVar62 * 4;
      goto LAB_0012bb50;
    }
  }
  else if ((puStack_10578 == (undefined1 *)0x3ec) || (puStack_10578 == (undefined1 *)0x3ee)) {
    if (0 < lVar62) {
      sVar34 = lVar62 * 8;
      goto LAB_0012bb50;
    }
  }
  else if (0 < lVar62) {
    sVar34 = lVar62 * 0x10;
LAB_0012bb50:
    memset(pDVar52,0,sVar34);
  }
  lVar57 = (long)(int)puStack_105b8;
  lVar62 = (long)(int)pDStack_105a0;
  uVar23 = (ulong)(((uint)uStack_10658 ^ 1) << 3);
  pDVar26 = *(DoubleComplex **)((long)a_ar + uVar23);
  pnga_nbwait((Integer *)((long)gNbhdlA + uVar23));
  if ((int)pDStack_105c0 != 0) {
    uVar23 = (ulong)(((uint)uStack_10640 ^ 1) << 3);
    pDStack_10650 = *(DoubleComplex **)((long)apDStack_104a8 + uVar23);
    pnga_nbwait((Integer *)((long)gNbhdlB + uVar23));
  }
  GAI_DGEMM((Integer)puStack_10578,(char *)pbStack_10568,(char *)pbStack_10570,
            (Integer)puStack_105f8,lStack_10648,(Integer)puStack_105a8,alpha,pDVar26,
            (Integer)pDVar53,pDStack_10650,(Integer)puStack_10588,pDVar52,cdim_prev);
  hiC_1[0] = iVar12 + cilo;
  ld[0] = lVar57 + cilo;
  hiC_1[1] = lVar62 + cjlo;
  ld[1] = (int)puVar51 + cjlo;
  if ((puStack_10578 != (undefined1 *)0x3eb) && (puStack_10578 != (undefined1 *)0x3ee)) {
    pIStack_10450 = &irreg;
  }
  pnga_acc(g_c,hiC_1,ld,pDVar52,&cdim_prev,pIStack_10450);
LAB_0012bc98:
  if (bVar66) {
    ARMCI_Free_local(a_ar[0]);
  }
  else {
    pnga_free(a_ar[0]);
  }
  if (iStack_1046c != 0) {
    pnga_pgroup_sync(grp_id);
  }
  return;
}

Assistant:

void pnga_matmul(transa, transb, alpha, beta,
	       g_a, ailo, aihi, ajlo, ajhi,
	       g_b, bilo, bihi, bjlo, bjhi,
	       g_c, cilo, cihi, cjlo, cjhi)
     
     Integer g_a, ailo, aihi, ajlo, ajhi;    /* patch of g_a */
     Integer g_b, bilo, bihi, bjlo, bjhi;    /* patch of g_b */
     Integer g_c, cilo, cihi, cjlo, cjhi;    /* patch of g_c */
     void    *alpha, *beta;
     char    *transa, *transb;
{
    DoubleComplex *a=NULL, *b, *c, *a_ar[2], *b_ar[2], *c_ar[2];
    Integer adim1=0, adim2=0, bdim1=0, bdim2=0, cdim1=0, cdim2=0, dims[2];
    Integer atype, btype, ctype, rank, me= pnga_nodeid();
    Integer n, m, k, Ichunk, Kchunk, Jchunk;
    Integer loA[2]={0,0}, hiA[2]={0,0};
    Integer loB[2]={0,0}, hiB[2]={0,0};
    Integer loC[2]={0,0}, hiC[2]={0,0};
    int local_sync_begin,local_sync_end;
    short int need_scaling=SET,use_NB_matmul=SET;
    short int irregular=UNSET, use_armci_memory=UNSET;
    Integer a_grp=pnga_get_pgroup(g_a), b_grp=pnga_get_pgroup(g_b);
    Integer c_grp=pnga_get_pgroup(g_c);
    Integer numblocks;
    Integer clo[2], chi[2];

    /* OPTIMIZATIONS FLAGS. To unset an optimization, replace SET by UNSET) */
    CYCLIC_DISTR_OPT_FLAG  = UNSET;
    CONTIG_CHUNKS_OPT_FLAG = SET;
    DIRECT_ACCESS_OPT_FLAG = SET;

    local_sync_begin = _ga_sync_begin; local_sync_end = _ga_sync_end;
    _ga_sync_begin = 1; _ga_sync_end=1; /*remove any previous masking*/
    if(local_sync_begin)pnga_pgroup_sync(a_grp);


    if (a_grp != b_grp || a_grp != c_grp)
       pnga_error("Arrays must be defined on same group",0L);
# if 0 /* disabled. should not fail if there are non-overlapping patches*/
    /* check if C is different from A and B */
    if (g_c == g_a || g_c == g_b)
       pnga_error("Global Array C should be different from A and B", 0);
#endif
    
    /**************************************************
     * Do All Sanity Checks 
     **************************************************/

    /* Check to make sure all global arrays are of the same type */
    if (!(pnga_is_mirrored(g_a) == pnga_is_mirrored(g_b) &&
	  pnga_is_mirrored(g_a) == pnga_is_mirrored(g_c))) {
       pnga_error("Processors do not match for all arrays",pnga_nnodes());
    }

    /* check if ranks are O.K. */
    pnga_inquire(g_a, &atype, &rank, dims); 
    VECTORCHECK(rank, dims, adim1, adim2, ailo, aihi, ajlo, ajhi);
    pnga_inquire(g_b, &btype, &rank, dims); 
    VECTORCHECK(rank, dims, bdim1, bdim2, bilo, bihi, bjlo, bjhi);
    pnga_inquire(g_c, &ctype, &rank, dims); 
    VECTORCHECK(rank, dims, cdim1, cdim2, cilo, cihi, cjlo, cjhi);

    /* check for data-types mismatch */
    if(atype != btype || atype != ctype ) pnga_error(" types mismatch ", 0L);
    if(atype != C_DCPL && atype != C_DBL && atype != C_FLOAT && atype!=C_SCPL)
       pnga_error(" type error",atype);
   
    /* check if patch indices and dims match */
    if (*transa == 'n' || *transa == 'N'){
       if (ailo <= 0 || aihi > adim1 || ajlo <= 0 || ajhi > adim2)
	  pnga_error("  g_a indices out of range ", g_a);
    }else
       if (ailo <= 0 || aihi > adim2 || ajlo <= 0 || ajhi > adim1)
	  pnga_error("  g_a indices out of range ", g_a);
   
    if (*transb == 'n' || *transb == 'N'){
       if (bilo <= 0 || bihi > bdim1 || bjlo <= 0 || bjhi > bdim2)
	  pnga_error("  g_b indices out of range ", g_b);
    }else
       if (bilo <= 0 || bihi > bdim2 || bjlo <= 0 || bjhi > bdim1)
	  pnga_error("  g_b indices out of range ", g_b);
   
    if (cilo <= 0 || cihi > cdim1 || cjlo <= 0 || cjhi > cdim2)
       pnga_error("  g_c indices out of range ", g_c);

    /* verify if patch dimensions are consistent */
    m = aihi - ailo +1;
    n = bjhi - bjlo +1;
    k = ajhi - ajlo +1;
    if( (cihi - cilo +1) != m) pnga_error(" a & c dims error",m);
    if( (cjhi - cjlo +1) != n) pnga_error(" b & c dims error",n);
    if( (bihi - bilo +1) != k) pnga_error(" a & b dims error",k);

#if DEBUG_
    if(me==0) check_result(0, transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi);
    pnga_sync();
#endif

    /* switch to various matmul algorithms here. more to come */
    if( GA[GA_OFFSET + g_c].irreg == 1 ||
	GA[GA_OFFSET + g_b].irreg == 1 ||
	GA[GA_OFFSET + g_a].irreg == 1 ||
	_gai_matmul_patch_flag == SET) irregular = SET;

    /* even ga_dgemm is called, m,n & k might not match GA dimensions */
    pnga_inquire(g_c, &ctype, &rank, dims);
    if(dims[0] != m || dims[1] != n) irregular = SET; /* C matrix dims */

    if(!irregular) {
       if((adim1=GA_Cluster_nnodes()) > 1) use_NB_matmul = SET;
       else {
	  use_NB_matmul = UNSET;
	  CONTIG_CHUNKS_OPT_FLAG = UNSET;
	  DIRECT_ACCESS_OPT_FLAG = UNSET;
       }
    }

    /* if block cyclic, then use regular algorithm. This is turned on for now
     * to test block cyclic */ 
    numblocks = pnga_total_blocks(g_c);
    if(numblocks>=0) {
#if 0
       irregular     = UNSET;
       use_NB_matmul = SET; 
#else
       loA[0] = ailo;
       loA[1] = ajlo;
       hiA[0] = aihi;
       hiA[1] = ajhi;
       loB[0] = bilo;
       loB[1] = bjlo;
       hiB[0] = bihi;
       hiB[1] = bjhi;
       loC[0] = cilo;
       loC[1] = cjlo;
       hiC[0] = cihi;
       hiC[1] = cjhi;
       pnga_matmul_basic(transa, transb, alpha, beta, g_a, loA, hiA,
         g_b, loB, hiB, g_c, loC, hiC);
       return;
#endif
    }
    
    /****************************************************************
     * Get the memory (i.e.static or dynamic) for temporary buffers 
     ****************************************************************/

    /* to skip accumulate and exploit data locality:
       get chunks according to "C" matrix distribution*/
    pnga_distribution(g_a, me, loA, hiA);
    pnga_distribution(g_b, me, loB, hiB);
    pnga_distribution(g_c, me, loC, hiC);

       {
	  Integer elems, factor=sizeof(DoubleComplex)/GAsizeofM(atype);
	  short int nbuf=1;
	  DoubleComplex *tmp = NULL;

	  Ichunk = GA_MIN( (hiC[0]-loC[0]+1), (hiA[0]-loA[0]+1) );
	  Jchunk = GA_MIN( (hiC[1]-loC[1]+1), (hiB[1]-loB[1]+1) );
	  Kchunk = GA_MIN( (hiA[1]-loA[1]+1), (hiB[0]-loB[0]+1) );

#if KCHUNK_OPTIMIZATION /*works great for m=1000,n=1000,k=4000 kinda cases*/
	  pnga_distribution(g_a, me, loC, hiC);
	  Kchunk = hiC[1]-loC[1]+1;
	  pnga_distribution(g_b, me, loC, hiC);
	  Kchunk = GA_MIN(Kchunk, (hiC[0]-loC[0]+1));
#endif

	  /* Just to avoid divide by zero error */
          if(Ichunk<=0) Ichunk = 1;
          if(Jchunk<=0) Jchunk = 1;
          if(Kchunk<=0) Kchunk = 1;

	  {
	     Integer irreg=0;
	     if(Ichunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Ichunk > GA_ASPECT_RATIO || 
		Jchunk/Kchunk > GA_ASPECT_RATIO || Kchunk/Jchunk > GA_ASPECT_RATIO) {
                irreg = SET;
             }
	     pnga_pgroup_gop(a_grp, pnga_type_f2c(MT_F_INT), &irreg, (Integer)1, "max");   
	     if(irreg==SET) irregular = SET;
	  }
	  
	  /* If non-blocking, we need 2 temporary buffers for A and B matrix */
	  if(use_NB_matmul) nbuf = 2; 
	  
	  if(!irregular) {
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }
	  
	  /* get ChunkSize (i.e.BlockSize), that fits in temporary buffer */
	  gai_get_chunk_size(irregular, &Ichunk, &Jchunk, &Kchunk, &elems, 
			     atype, m, n, k, nbuf, use_armci_memory, a_grp);
	  
	  if(tmp == NULL) { /* try once again from armci for new chunk sizes */
	     tmp = a_ar[0] =a=gai_get_armci_memory(Ichunk,Jchunk,Kchunk,
						   nbuf, atype);
	     if(tmp != NULL) use_armci_memory = SET;
	  }

	  if(tmp == NULL) { /*if armci malloc fails again, then get from MA */
	     tmp = a_ar[0] = a =(DoubleComplex*) pnga_malloc(elems,atype,
                                                      "GA mulmat bufs");
	  }

	  if(use_NB_matmul) tmp = a_ar[1] = a_ar[0] + (Ichunk*Kchunk)/factor+1;
	  
	  tmp = b_ar[0] = b = tmp + (Ichunk*Kchunk)/factor + 1;
	  if(use_NB_matmul) tmp = b_ar[1] = b_ar[0] + (Kchunk*Jchunk)/factor+1;
	  
	  c_ar[0] = c = tmp + (Kchunk*Jchunk)/factor + 1;
       }
       
       /** check if there is a need for scaling the data. 
	   Note: if beta=0, then need_scaling=0  */
       if(atype==C_DCPL){
	  if((((DoubleComplex*)beta)->real == 0) && 
	     (((DoubleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_SCPL){
	  if((((SingleComplex*)beta)->real == 0) && 
	     (((SingleComplex*)beta)->imag ==0)) need_scaling =0;} 
       else if(atype==C_DBL){
	  if(*(DoublePrecision *)beta == 0) need_scaling =0;}
       else if( *(float*)beta ==0) need_scaling =0;

       clo[0] = cilo; clo[1] = cjlo;
       chi[0] = cihi; chi[1] = cjhi;
       if(need_scaling) pnga_scale_patch(g_c, clo, chi, beta);

       /********************************************************************
	* Parallel Matrix Multiplication Starts Here.
	* 3 Steps:
	*    1. Get a chunk of A and B matrix, and store it in local buffer.
	*    2. Do sequential dgemm.
	*    3. Put/accumulate the result into C matrix.
	*********************************************************************/

       /* if only one node, then enable the optimized shmem code */
       if(use_NB_matmul==UNSET) { 
	  gai_matmul_shmem(transa, transb, alpha, beta, atype,
			   g_a, ailo, aihi, ajlo, ajhi,
			   g_b, bilo, bihi, bjlo, bjhi,
			   g_c, cilo, cihi, cjlo, cjhi,
			   Ichunk, Kchunk, Jchunk, a,b,c, need_scaling);
       }
       else {
	  if(irregular)
	     gai_matmul_irreg(transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi,
			      Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar,
			      need_scaling, irregular);
	  else {
	     gai_matmul_regular(transa, transb, alpha, beta, atype,
				g_a, ailo, aihi, ajlo, ajhi,
				g_b, bilo, bihi, bjlo, bjhi,
				g_c, cilo, cihi, cjlo, cjhi,
				Ichunk, Kchunk, Jchunk, a_ar, b_ar, c_ar, 
				need_scaling, irregular);
     }
       }
	     
       a = a_ar[0];
       if(use_armci_memory == SET) ARMCI_Free_local(a);
       else {
         pnga_free(a);
       }
       
#if DEBUG_
       Integer grp_me;
       grp_me = pnga_pgroup_nodeid(a_grp);
       pnga_pgroup_sync(a_grp);
       if(me==0) check_result(1, transa, transb, alpha, beta, atype,
			      g_a, ailo, aihi, ajlo, ajhi,
			      g_b, bilo, bihi, bjlo, bjhi,
			      g_c, cilo, cihi, cjlo, cjhi);
       pnga_pgroup_sync(a_grp);
#endif
       
       if(local_sync_end)pnga_pgroup_sync(a_grp);
}